

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O3

int archive_read_format_cpio_skip(archive_read *a)

{
  void *pvVar1;
  int iVar2;
  int64_t iVar3;
  long request;
  
  pvVar1 = a->format->data;
  request = *(long *)((long)pvVar1 + 0x30) + *(long *)((long)pvVar1 + 0x18) +
            *(long *)((long)pvVar1 + 0x20);
  iVar3 = __archive_read_consume(a,request);
  iVar2 = -0x1e;
  if (request == iVar3) {
    *(undefined8 *)((long)pvVar1 + 0x30) = 0;
    *(undefined8 *)((long)pvVar1 + 0x18) = 0;
    *(undefined8 *)((long)pvVar1 + 0x20) = 0;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
archive_read_format_cpio_skip(struct archive_read *a)
{
	struct cpio *cpio = (struct cpio *)(a->format->data);
	int64_t to_skip = cpio->entry_bytes_remaining + cpio->entry_padding +
		cpio->entry_bytes_unconsumed;

	if (to_skip != __archive_read_consume(a, to_skip)) {
		return (ARCHIVE_FATAL);
	}
	cpio->entry_bytes_remaining = 0;
	cpio->entry_padding = 0;
	cpio->entry_bytes_unconsumed = 0;
	return (ARCHIVE_OK);
}